

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::peer_connection::incoming_suggest(peer_connection *this,piece_index_t index)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  element_type *peVar6;
  element_type *peVar7;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  local_80;
  const_iterator local_78;
  int local_70;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_6c;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_68 [5];
  uint local_54;
  __shared_ptr_access<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_50;
  shared_ptr<libtorrent::peer_plugin> *e;
  iterator __end2;
  iterator __begin2;
  list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
  *__range2;
  undefined1 local_28 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  peer_connection *this_local;
  piece_index_t index_local;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  this_local._4_4_ = index.m_val;
  uVar2 = strong_typedef::operator_cast_to_int((strong_typedef *)((long)&this_local + 4));
  peer_log(this,incoming_message,"SUGGEST_PIECE","piece: %d",(ulong)uVar2);
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_28);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
  if (bVar1) {
    __end2 = ::std::__cxx11::
             list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
             ::begin(&this->m_extensions);
    e = (shared_ptr<libtorrent::peer_plugin> *)
        ::std::__cxx11::
        list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
        ::end(&this->m_extensions);
    while (bVar1 = ::std::operator!=(&__end2,(_Self *)&e), bVar1) {
      local_50 = (__shared_ptr_access<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)::std::_List_iterator<std::shared_ptr<libtorrent::peer_plugin>_>::operator*
                              (&__end2);
      peVar6 = ::std::
               __shared_ptr_access<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_50);
      local_54 = this_local._4_4_;
      uVar2 = (*peVar6->_vptr_peer_plugin[0x16])(peVar6,(ulong)(uint)this_local._4_4_);
      if ((uVar2 & 1) != 0) goto LAB_00443414;
      ::std::_List_iterator<std::shared_ptr<libtorrent::peer_plugin>_>::operator++(&__end2);
    }
    uVar2 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
    if ((uVar2 & 1) == 0) {
      strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(local_68,0);
      bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                        ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                         ((long)&this_local + 4),local_68);
      if (bVar1) {
        uVar2 = strong_typedef::operator_cast_to_int((strong_typedef *)((long)&this_local + 4));
        peer_log(this,incoming_message,"INVALID_SUGGEST_PIECE","%d",(ulong)uVar2);
      }
      else {
        peVar7 = ::std::
                 __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_28);
        bVar1 = torrent::valid_metadata(peVar7);
        if (bVar1) {
          local_6c = typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                     ::end_index(&(this->super_peer_connection_hot_members).m_have_piece);
          bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator>=
                            ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                             ((long)&this_local + 4),&local_6c);
          if (bVar1) {
            uVar2 = strong_typedef::operator_cast_to_int((strong_typedef *)((long)&this_local + 4));
            uVar5 = bitfield::size((bitfield *)&this->super_peer_connection_hot_members);
            peer_log(this,incoming_message,"INVALID_SUGGEST","%d s: %d",(ulong)uVar2,(ulong)uVar5);
            goto LAB_00443414;
          }
          peVar7 = ::std::
                   __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_28);
          local_70 = this_local._4_4_;
          bVar1 = torrent::have_piece(peVar7,this_local._4_4_);
          if (bVar1) goto LAB_00443414;
        }
        iVar3 = container_wrapper<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_int,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                ::end_index(&this->m_suggested_pieces);
        iVar4 = session_settings::get_int
                          ((this->super_peer_connection_hot_members).m_settings,0x4042);
        if (iVar4 < iVar3) {
          iVar3 = session_settings::get_int
                            ((this->super_peer_connection_hot_members).m_settings,0x4042);
          container_wrapper<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,int,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>
          ::resize<int,void>((container_wrapper<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,int,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>
                              *)&this->m_suggested_pieces,iVar3 + -1);
        }
        local_80._M_current =
             (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
             ::std::
             vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
             ::begin(&(this->m_suggested_pieces).
                      super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                    );
        __gnu_cxx::
        __normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>
        ::
        __normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>*>
                  ((__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>
                    *)&local_78,&local_80);
        ::std::
        vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
        ::insert(&(this->m_suggested_pieces).
                  super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                 ,local_78,(value_type *)((long)&this_local + 4));
        uVar2 = strong_typedef::operator_cast_to_int((strong_typedef *)((long)&this_local + 4));
        uVar5 = container_wrapper<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_int,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                ::end_index(&this->m_suggested_pieces);
        peer_log(this,info,"SUGGEST_PIECE","piece: %d added to set: %d",(ulong)uVar2,(ulong)uVar5);
      }
    }
  }
LAB_00443414:
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_28);
  return;
}

Assistant:

void peer_connection::incoming_suggest(piece_index_t const index)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::incoming_message, "SUGGEST_PIECE"
			, "piece: %d", static_cast<int>(index));
#endif
		auto t = m_torrent.lock();
		if (!t) return;

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& e : m_extensions)
		{
			if (e->on_suggest(index)) return;
		}
#endif

		if (is_disconnecting()) return;
		if (index < piece_index_t(0))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::incoming_message, "INVALID_SUGGEST_PIECE"
				, "%d", static_cast<int>(index));
#endif
			return;
		}

		if (t->valid_metadata())
		{
			if (index >= m_have_piece.end_index())
			{
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::incoming_message, "INVALID_SUGGEST"
					, "%d s: %d", static_cast<int>(index), m_have_piece.size());
#endif
				return;
			}

			// if we already have the piece, we can
			// ignore this message
			if (t->have_piece(index))
				return;
		}

		// the piece picker will prioritize the pieces from the beginning to end.
		// the later the suggestion is received, the higher priority we should
		// ascribe to it, so we need to insert suggestions at the front of the
		// queue.
		if (m_suggested_pieces.end_index() > m_settings.get_int(settings_pack::max_suggest_pieces))
			m_suggested_pieces.resize(m_settings.get_int(settings_pack::max_suggest_pieces) - 1);

		m_suggested_pieces.insert(m_suggested_pieces.begin(), index);

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::info, "SUGGEST_PIECE", "piece: %d added to set: %d"
			, static_cast<int>(index), m_suggested_pieces.end_index());
#endif
	}